

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O1

char * test_quaternion_get_eulers_create_quaternion_ZYX(void)

{
  short sVar1;
  int iVar2;
  char *pcVar3;
  double out_anglez;
  double out_angley;
  double out_anglex;
  quaternion q1;
  quaternion q2;
  double local_68;
  double local_60;
  double local_58;
  quaternion local_50;
  quaternion local_30;
  
  quaternion_set_from_euler_anglesf3
            (&local_50,0.800000011920929,0.699999988079071,0.4320000112056732);
  quaternion_get_euler_anglesf3(&local_50,&local_58,&local_60,&local_68);
  sVar1 = scalar_equalsf(0.800000011920929,local_58);
  if (sVar1 == 0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(334) : (assertion failed) ((scalar_equalsf(in_anglex, out_anglex)))"
    ;
  }
  else {
    sVar1 = scalar_equalsf(0.699999988079071,local_60);
    if (sVar1 == 0) {
      pcVar3 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(335) : (assertion failed) ((scalar_equalsf(in_angley, out_angley)))"
      ;
    }
    else {
      sVar1 = scalar_equalsf(0.4320000112056732,local_68);
      if (sVar1 == 0) {
        pcVar3 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(336) : (assertion failed) ((scalar_equalsf(in_anglez, out_anglez)))"
        ;
      }
      else {
        quaternion_set_from_euler_anglesf3(&local_30,local_58,local_60,local_68);
        iVar2 = quaternion_equals(&local_50,&local_30);
        pcVar3 = (char *)0x0;
        if (iVar2 == 0) {
          pcVar3 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(342) : (assertion failed) ((quaternion_equals(&q1, &q2)))"
          ;
        }
      }
    }
  }
  return pcVar3;
}

Assistant:

static char *test_quaternion_get_eulers_create_quaternion_ZYX(void)
{
	struct quaternion q1, q2;
	HYP_FLOAT in_anglex, in_angley, in_anglez;
	HYP_FLOAT out_anglex, out_angley, out_anglez;

	in_anglex = 0.8f;
	in_angley = 0.7f;
	in_anglez = 0.432f;

	/* make a quaternion out of some arbitrary euler angles */
	quaternion_set_from_euler_anglesf3(&q1, in_anglex, in_angley, in_anglez);

	/* get the angles */
	quaternion_get_euler_anglesf3(&q1, &out_anglex, &out_angley, &out_anglez);

	/* test */
	test_assert(scalar_equals(in_anglex, out_anglex));
	test_assert(scalar_equals(in_angley, out_angley));
	test_assert(scalar_equals(in_anglez, out_anglez));

	/* compose new quaternions with the eulers */
	quaternion_set_from_euler_anglesf3(&q2, out_anglex, out_angley, out_anglez);

	/* same */
	test_assert(quaternion_equals(&q1, &q2));

	return NULL;
}